

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  byte *srcBuffer;
  undefined1 *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  long lVar9;
  BIT_DStream_status BVar10;
  BIT_DStream_status BVar11;
  BIT_DStream_status BVar12;
  BIT_DStream_status BVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  byte bVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  int in_R9D;
  int iVar23;
  ulong uVar24;
  int iVar25;
  undefined1 *puVar26;
  ulong uVar27;
  undefined1 *puVar28;
  bool bVar29;
  BIT_DStream_t BStack_1c8;
  BIT_DStream_t BStack_198;
  BIT_DStream_t BStack_168;
  int iStack_140;
  undefined1 *puStack_138;
  size_t sStack_130;
  ulong uStack_128;
  BIT_DStream_t BStack_120;
  undefined1 *puStack_f8;
  int iStack_f0;
  ulong *puStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  undefined1 *puStack_d0;
  ulong *puStack_b8;
  ulong uStack_b0;
  ulong uStack_90;
  size_t sStack_70;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar16 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,in_R9D);
    return sVar16;
  }
  if (9 < cSrcSize) {
    uVar6 = *cSrc;
    uVar24 = (ulong)uVar6;
    uVar7 = *(ushort *)((long)cSrc + 2);
    uVar18 = (ulong)uVar7;
    uVar8 = *(ushort *)((long)cSrc + 4);
    uVar15 = (ulong)uVar8;
    uVar20 = uVar18 + uVar24 + uVar15 + 6;
    if (uVar20 <= cSrcSize) {
      BStack_198.start = (char *)((long)cSrc + uVar24 + 6);
      if (uVar24 == 0) {
        BStack_168.ptr = (char *)0x0;
        BStack_168.start = (char *)0x0;
        BStack_168.bitContainer = 0;
        BStack_168._8_8_ = 0;
        BStack_168.limitPtr = (char *)0x0;
        uVar27 = 0xffffffffffffffb8;
      }
      else {
        BStack_168.start = (char *)((long)cSrc + 6);
        BStack_168.limitPtr = (char *)((long)cSrc + 0xe);
        uVar27 = uVar24;
        if (uVar6 < 8) {
          BStack_168.bitContainer = (size_t)(byte)*BStack_168.start;
          switch(uVar6) {
          case 7:
            BStack_168.bitContainer =
                 (ulong)*(byte *)((long)cSrc + 0xc) << 0x30 | BStack_168.bitContainer;
          case 6:
            BStack_168.bitContainer =
                 BStack_168.bitContainer + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
          case 5:
            BStack_168.bitContainer =
                 BStack_168.bitContainer + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
          case 4:
            BStack_168.bitContainer =
                 BStack_168.bitContainer + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
          case 3:
            BStack_168.bitContainer =
                 BStack_168.bitContainer + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
          case 2:
            BStack_168.bitContainer =
                 BStack_168.bitContainer + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
          default:
            bVar17 = *(byte *)((long)cSrc + uVar24 + 5);
            uVar14 = 0x1f;
            if (bVar17 != 0) {
              for (; bVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            BStack_168.bitsConsumed = ~uVar14 + 9;
            if (bVar17 == 0) {
              BStack_168.bitsConsumed = 0;
            }
            BStack_168.ptr = BStack_168.start;
            if (bVar17 == 0) {
              uVar27 = 0xffffffffffffffec;
            }
            else {
              BStack_168.bitsConsumed = BStack_168.bitsConsumed + ((uint)uVar6 * -8 + 0x40 & 0xffff)
              ;
            }
          }
        }
        else {
          BStack_168.ptr = (char *)((long)cSrc + (uVar24 - 2));
          BStack_168.bitContainer = *(ulong *)((long)cSrc + (uVar24 - 2));
          bVar17 = *(byte *)((long)cSrc + uVar24 + 5);
          uVar14 = 0x1f;
          if (bVar17 != 0) {
            for (; bVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          BStack_168.bitsConsumed = ~uVar14 + 9;
          if (bVar17 == 0) {
            BStack_168.bitsConsumed = 0;
          }
          if (bVar17 == 0) {
            uVar27 = 0xffffffffffffffff;
          }
        }
      }
      if (0xffffffffffffff88 < uVar27) {
        return uVar27;
      }
      BStack_1c8.start = (char *)((long)BStack_198.start + uVar18);
      if (uVar18 == 0) {
        BStack_198.ptr = (char *)0x0;
        BStack_198.start = (char *)0x0;
        BStack_198.bitContainer = 0;
        BStack_198._8_8_ = 0;
        BStack_198.limitPtr = (char *)0x0;
        uVar18 = 0xffffffffffffffb8;
      }
      else {
        BStack_198.limitPtr = (char *)((long)cSrc + uVar24 + 0xe);
        if (uVar7 < 8) {
          BStack_198.bitContainer = (size_t)(byte)*(ulong *)BStack_198.start;
          switch(uVar7) {
          case 7:
            BStack_198.bitContainer =
                 (ulong)*(byte *)((long)cSrc + uVar24 + 0xc) << 0x30 | BStack_198.bitContainer;
          case 6:
            BStack_198.bitContainer =
                 BStack_198.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar24 + 0xb) << 0x28);
          case 5:
            BStack_198.bitContainer =
                 BStack_198.bitContainer + ((ulong)*(byte *)((long)cSrc + uVar24 + 10) << 0x20);
          case 4:
            BStack_198.bitContainer =
                 BStack_198.bitContainer + (ulong)*(byte *)((long)cSrc + uVar24 + 9) * 0x1000000;
          case 3:
            BStack_198.bitContainer =
                 BStack_198.bitContainer + (ulong)*(byte *)((long)cSrc + uVar24 + 8) * 0x10000;
          case 2:
            BStack_198.bitContainer =
                 BStack_198.bitContainer + (ulong)*(byte *)((long)cSrc + uVar24 + 7) * 0x100;
          default:
            bVar17 = *(byte *)((long)BStack_1c8.start + -1);
            uVar14 = 0x1f;
            if (bVar17 != 0) {
              for (; bVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            BStack_198.bitsConsumed = ~uVar14 + 9;
            if (bVar17 == 0) {
              BStack_198.bitsConsumed = 0;
            }
            BStack_198.ptr = BStack_198.start;
            if (bVar17 == 0) {
              uVar18 = 0xffffffffffffffec;
            }
            else {
              BStack_198.bitsConsumed = BStack_198.bitsConsumed + ((uint)uVar7 * -8 + 0x40 & 0xffff)
              ;
            }
          }
        }
        else {
          BStack_198.bitContainer = *(ulong *)((long)BStack_1c8.start + -8);
          bVar17 = *(byte *)((long)BStack_1c8.start + -1);
          uVar14 = 0x1f;
          if (bVar17 != 0) {
            for (; bVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          BStack_198.bitsConsumed = ~uVar14 + 9;
          if (bVar17 == 0) {
            BStack_198.bitsConsumed = 0;
          }
          BStack_198.ptr = (char *)((long)BStack_1c8.start + -8);
          if (bVar17 == 0) {
            uVar18 = 0xffffffffffffffff;
          }
        }
      }
      if (0xffffffffffffff88 < uVar18) {
        return uVar18;
      }
      srcBuffer = (byte *)((long)BStack_1c8.start + uVar15);
      if (uVar15 == 0) {
        BStack_1c8.ptr = (char *)0x0;
        BStack_1c8.start = (char *)0x0;
        BStack_1c8.bitContainer = 0;
        BStack_1c8._8_8_ = 0;
        BStack_1c8.limitPtr = (char *)0x0;
        uVar15 = 0xffffffffffffffb8;
      }
      else {
        BStack_1c8.limitPtr = (char *)((long)BStack_1c8.start + 8);
        if (uVar8 < 8) {
          BStack_1c8.bitContainer = (size_t)(byte)*(ulong *)BStack_1c8.start;
          switch(uVar8) {
          case 7:
            BStack_1c8.bitContainer =
                 (ulong)*(byte *)((long)BStack_1c8.start + 6) << 0x30 | BStack_1c8.bitContainer;
          case 6:
            BStack_1c8.bitContainer =
                 BStack_1c8.bitContainer + ((ulong)*(byte *)((long)BStack_1c8.start + 5) << 0x28);
          case 5:
            BStack_1c8.bitContainer =
                 BStack_1c8.bitContainer + ((ulong)*(byte *)((long)BStack_1c8.start + 4) << 0x20);
          case 4:
            BStack_1c8.bitContainer =
                 BStack_1c8.bitContainer + (ulong)*(byte *)((long)BStack_1c8.start + 3) * 0x1000000;
          case 3:
            BStack_1c8.bitContainer =
                 BStack_1c8.bitContainer + (ulong)*(byte *)((long)BStack_1c8.start + 2) * 0x10000;
          case 2:
            BStack_1c8.bitContainer =
                 BStack_1c8.bitContainer + (ulong)*(byte *)((long)BStack_1c8.start + 1) * 0x100;
          default:
            bVar17 = srcBuffer[-1];
            uVar14 = 0x1f;
            if (bVar17 != 0) {
              for (; bVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            BStack_1c8.bitsConsumed = ~uVar14 + 9;
            if (bVar17 == 0) {
              BStack_1c8.bitsConsumed = 0;
            }
            BStack_1c8.ptr = BStack_1c8.start;
            if (bVar17 == 0) {
              uVar15 = 0xffffffffffffffec;
            }
            else {
              BStack_1c8.bitsConsumed = BStack_1c8.bitsConsumed + ((uint)uVar8 * -8 + 0x40 & 0xffff)
              ;
            }
          }
        }
        else {
          BStack_1c8.bitContainer = *(size_t *)(srcBuffer + -8);
          bVar17 = srcBuffer[-1];
          uVar14 = 0x1f;
          if (bVar17 != 0) {
            for (; bVar17 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          BStack_1c8.bitsConsumed = ~uVar14 + 9;
          if (bVar17 == 0) {
            BStack_1c8.bitsConsumed = 0;
          }
          BStack_1c8.ptr = (char *)(srcBuffer + -8);
          if (bVar17 == 0) {
            uVar15 = 0xffffffffffffffff;
          }
        }
      }
      if (0xffffffffffffff88 < uVar15) {
        return uVar15;
      }
      uVar6 = *(ushort *)((long)DTable + 2);
      sVar16 = BIT_initDStream(&BStack_120,srcBuffer,cSrcSize - uVar20);
      if (0xffffffffffffff88 < sVar16) {
        return sVar16;
      }
      uStack_b0 = maxDstSize + 3 >> 2;
      puStack_d0 = (undefined1 *)(uStack_b0 + (long)dst);
      puStack_f8 = puStack_d0 + uStack_b0;
      puVar26 = (undefined1 *)(maxDstSize + (long)dst);
      puVar2 = puStack_f8 + uStack_b0;
      uStack_90 = (ulong)uVar6;
      sStack_70 = maxDstSize;
      BVar10 = BIT_reloadDStream(&BStack_168);
      BVar11 = BIT_reloadDStream(&BStack_198);
      BVar12 = BIT_reloadDStream(&BStack_1c8);
      BVar13 = BIT_reloadDStream(&BStack_120);
      puVar1 = puVar26 + -3;
      uStack_d8 = BStack_168.bitContainer;
      uStack_128 = BStack_198.bitContainer;
      uStack_e0 = BStack_1c8.bitContainer;
      sStack_130 = BStack_120.bitContainer;
      iStack_f0 = (int)BStack_1c8.start;
      iStack_140 = (int)BStack_120.start;
      puVar21 = puStack_d0;
      puVar28 = puStack_f8;
      puStack_138 = puVar2;
      if ((BVar13 == BIT_DStream_unfinished &&
           (BVar12 == BIT_DStream_unfinished &&
           (BVar11 == BIT_DStream_unfinished && BVar10 == BIT_DStream_unfinished))) &&
         (puVar2 < puVar1)) {
        bVar17 = -(char)uStack_90 & 0x3f;
        puStack_b8 = (ulong *)BStack_168.ptr;
        puStack_e8 = (ulong *)BStack_198.ptr;
        lVar9 = uStack_b0 * 3;
        do {
          puVar21 = (undefined1 *)dst;
          uVar20 = (uStack_d8 << ((byte)BStack_168.bitsConsumed & 0x3f)) >> bVar17;
          uVar15 = (uStack_128 << ((byte)BStack_198.bitsConsumed & 0x3f)) >> bVar17;
          uVar18 = (uStack_e0 << ((byte)BStack_1c8.bitsConsumed & 0x3f)) >> bVar17;
          uVar24 = (sStack_130 << ((byte)BStack_120.bitsConsumed & 0x3f)) >> bVar17;
          iVar23 = *(byte *)((long)DTable + uVar20 * 2 + 5) + BStack_168.bitsConsumed;
          *puVar21 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
          iVar25 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_198.bitsConsumed;
          puVar21[uStack_b0] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          iVar19 = *(byte *)((long)DTable + uVar18 * 2 + 5) + BStack_1c8.bitsConsumed;
          puVar21[uStack_b0 * 2] = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
          uVar20 = (uStack_d8 << ((byte)iVar23 & 0x3f)) >> bVar17;
          uVar15 = (uStack_128 << ((byte)iVar25 & 0x3f)) >> bVar17;
          iVar22 = *(byte *)((long)DTable + uVar24 * 2 + 5) + BStack_120.bitsConsumed;
          uVar18 = (uStack_e0 << ((byte)iVar19 & 0x3f)) >> bVar17;
          uVar27 = (sStack_130 << ((byte)iVar22 & 0x3f)) >> bVar17;
          puVar21[lVar9] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
          iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar23;
          puVar21[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
          iVar25 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar25;
          puVar21[uStack_b0 + 1] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          iVar19 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 5) + iVar19;
          puVar21[uStack_b0 * 2 + 1] = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
          iVar22 = (uint)*(byte *)((long)DTable + uVar27 * 2 + 5) + iVar22;
          puVar21[lVar9 + 1] = *(undefined1 *)((long)DTable + uVar27 * 2 + 4);
          uVar20 = (uStack_d8 << ((byte)iVar23 & 0x3f)) >> bVar17;
          uVar15 = (uStack_128 << ((byte)iVar25 & 0x3f)) >> bVar17;
          iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar23;
          uVar24 = (uStack_e0 << ((byte)iVar19 & 0x3f)) >> bVar17;
          uVar18 = (sStack_130 << ((byte)iVar22 & 0x3f)) >> bVar17;
          puVar21[2] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
          iVar25 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar25;
          puVar21[uStack_b0 + 2] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          iVar19 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar19;
          puVar21[uStack_b0 * 2 + 2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
          iVar22 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 5) + iVar22;
          puVar21[lVar9 + 2] = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
          uVar15 = (uStack_d8 << ((byte)iVar23 & 0x3f)) >> bVar17;
          BStack_168.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
          puVar21[3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          uVar15 = (uStack_128 << ((byte)iVar25 & 0x3f)) >> bVar17;
          bVar3 = *(byte *)((long)DTable + uVar15 * 2 + 5);
          puVar21[uStack_b0 + 3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          uVar15 = (uStack_e0 << ((byte)iVar19 & 0x3f)) >> bVar17;
          bVar4 = *(byte *)((long)DTable + uVar15 * 2 + 5);
          puVar21[uStack_b0 * 2 + 3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          uVar15 = (sStack_130 << ((byte)iVar22 & 0x3f)) >> bVar17;
          bVar5 = *(byte *)((long)DTable + uVar15 * 2 + 5);
          puVar21[lVar9 + 3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          if (BStack_168.bitsConsumed < 0x41) {
            if (puStack_b8 < BStack_168.limitPtr) {
              if (puStack_b8 == (ulong *)BStack_168.start) goto LAB_004c1d43;
              uVar14 = (int)puStack_b8 - (int)BStack_168.start;
              if (BStack_168.start <=
                  (ulong *)((long)puStack_b8 - (ulong)(BStack_168.bitsConsumed >> 3))) {
                uVar14 = BStack_168.bitsConsumed >> 3;
              }
              BStack_168.bitsConsumed = BStack_168.bitsConsumed + uVar14 * -8;
            }
            else {
              uVar14 = BStack_168.bitsConsumed >> 3;
              BStack_168.bitsConsumed = BStack_168.bitsConsumed & 7;
            }
            puStack_b8 = (ulong *)((long)puStack_b8 - (ulong)uVar14);
            uStack_d8 = *puStack_b8;
          }
LAB_004c1d43:
          BStack_198.bitsConsumed = iVar25 + (uint)bVar3;
          if (BStack_198.bitsConsumed < 0x41) {
            if (puStack_e8 < BStack_198.limitPtr) {
              if (puStack_e8 == (ulong *)BStack_198.start) goto LAB_004c1dba;
              uVar14 = (int)puStack_e8 - (int)BStack_198.start;
              if (BStack_198.start <=
                  (ulong *)((long)puStack_e8 - (ulong)(BStack_198.bitsConsumed >> 3))) {
                uVar14 = BStack_198.bitsConsumed >> 3;
              }
              BStack_198.bitsConsumed = BStack_198.bitsConsumed + uVar14 * -8;
            }
            else {
              uVar14 = BStack_198.bitsConsumed >> 3;
              BStack_198.bitsConsumed = BStack_198.bitsConsumed & 7;
            }
            puStack_e8 = (ulong *)((long)puStack_e8 - (ulong)uVar14);
            uStack_128 = *puStack_e8;
          }
LAB_004c1dba:
          BStack_1c8.bitsConsumed = iVar19 + (uint)bVar4;
          if (BStack_1c8.bitsConsumed < 0x41) {
            if (BStack_1c8.ptr < BStack_1c8.limitPtr) {
              if (BStack_1c8.ptr == BStack_1c8.start) goto LAB_004c1e28;
              uVar14 = (int)BStack_1c8.ptr - iStack_f0;
              if (BStack_1c8.start <=
                  (ulong *)((long)BStack_1c8.ptr - (ulong)(BStack_1c8.bitsConsumed >> 3))) {
                uVar14 = BStack_1c8.bitsConsumed >> 3;
              }
              BStack_1c8.bitsConsumed = BStack_1c8.bitsConsumed + uVar14 * -8;
            }
            else {
              uVar14 = BStack_1c8.bitsConsumed >> 3;
              BStack_1c8.bitsConsumed = BStack_1c8.bitsConsumed & 7;
            }
            BStack_1c8.ptr = (char *)((long)BStack_1c8.ptr - (ulong)uVar14);
            uStack_e0 = *(ulong *)BStack_1c8.ptr;
          }
LAB_004c1e28:
          BStack_120.bitsConsumed = iVar22 + (uint)bVar5;
          if (BStack_120.bitsConsumed < 0x41) {
            if (BStack_120.ptr < BStack_120.limitPtr) {
              if (BStack_120.ptr == BStack_120.start) goto LAB_004c1ea2;
              uVar14 = (int)BStack_120.ptr - iStack_140;
              if (BStack_120.start <=
                  (size_t *)((long)BStack_120.ptr - (ulong)(BStack_120.bitsConsumed >> 3))) {
                uVar14 = BStack_120.bitsConsumed >> 3;
              }
              BStack_120.bitsConsumed = BStack_120.bitsConsumed + uVar14 * -8;
            }
            else {
              uVar14 = BStack_120.bitsConsumed >> 3;
              BStack_120.bitsConsumed = BStack_120.bitsConsumed & 7;
            }
            BStack_120.ptr = (char *)((long)BStack_120.ptr - (ulong)uVar14);
            sStack_130 = *(size_t *)BStack_120.ptr;
          }
LAB_004c1ea2:
        } while ((BVar13 == BIT_DStream_unfinished &&
                  (BVar12 == BIT_DStream_unfinished &&
                  (BVar11 == BIT_DStream_unfinished && BVar10 == BIT_DStream_unfinished))) &&
                (dst = puVar21 + 4, puVar21 + lVar9 + 4 < puVar1));
        dst = puVar21 + 4;
        BStack_168._12_4_ = 0;
        BStack_198._12_4_ = 0;
        BStack_1c8._12_4_ = 0;
        BStack_168.ptr = (char *)puStack_b8;
        puVar21 = (undefined1 *)((long)dst + uStack_b0);
        puVar28 = (undefined1 *)((long)dst + uStack_b0 * 2);
        BStack_198.ptr = (char *)puStack_e8;
        puStack_138 = (undefined1 *)((long)dst + lVar9);
      }
      BStack_168.bitContainer = uStack_d8;
      BStack_198.bitContainer = uStack_128;
      BStack_1c8.bitContainer = uStack_e0;
      BStack_120.bitContainer = sStack_130;
      if ((dst <= puStack_d0) && (puVar21 <= puStack_f8)) {
        if (puVar2 < puVar28) {
          return 0xffffffffffffffec;
        }
        bVar17 = -(char)uStack_90 & 0x3f;
        do {
          if (BStack_168.bitsConsumed < 0x41) {
            if (BStack_168.ptr < BStack_168.limitPtr) {
              if (BStack_168.ptr == BStack_168.start) goto LAB_004c1ff8;
              bVar29 = BStack_168.start <=
                       (ulong *)((long)BStack_168.ptr - (ulong)(BStack_168.bitsConsumed >> 3));
              uVar14 = (int)BStack_168.ptr - (int)BStack_168.start;
              if (bVar29) {
                uVar14 = BStack_168.bitsConsumed >> 3;
              }
              BStack_168.ptr = (char *)((long)BStack_168.ptr - (ulong)uVar14);
              BStack_168._12_4_ = 0;
              BStack_168.bitsConsumed = BStack_168.bitsConsumed + uVar14 * -8;
              BStack_168.bitContainer = *(size_t *)BStack_168.ptr;
            }
            else {
              BStack_168.ptr =
                   (char *)((long)BStack_168.ptr - (ulong)(BStack_168.bitsConsumed >> 3));
              BStack_168._12_4_ = 0;
              BStack_168.bitsConsumed = BStack_168.bitsConsumed & 7;
              BStack_168.bitContainer = *(size_t *)BStack_168.ptr;
              bVar29 = true;
            }
          }
          else {
LAB_004c1ff8:
            bVar29 = false;
          }
          if ((puStack_d0 + -3 <= dst) || (!bVar29)) goto LAB_004c2115;
          uVar15 = (BStack_168.bitContainer << ((byte)BStack_168.bitsConsumed & 0x3f)) >> bVar17;
          iVar23 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_168.bitsConsumed;
          uVar20 = (BStack_168.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
          *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar23;
          uVar18 = (BStack_168.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
          *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
          iVar23 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 5) + iVar23;
          uVar15 = (BStack_168.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
          *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
          BStack_168._12_4_ = 0;
          BStack_168.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
          *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
          dst = (void *)((long)dst + 4);
        } while( true );
      }
    }
  }
  return 0xffffffffffffffec;
LAB_004c2115:
  for (; dst < puStack_d0; dst = (void *)((long)dst + 1)) {
    uVar15 = (BStack_168.bitContainer << ((byte)BStack_168.bitsConsumed & 0x3f)) >> bVar17;
    BStack_168._12_4_ = 0;
    BStack_168.bitsConsumed = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_168.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
  }
  do {
    if (BStack_198.bitsConsumed < 0x41) {
      if (BStack_198.ptr < BStack_198.limitPtr) {
        if (BStack_198.ptr == BStack_198.start) goto LAB_004c2163;
        bVar29 = BStack_198.start <=
                 (ulong *)((long)BStack_198.ptr - (ulong)(BStack_198.bitsConsumed >> 3));
        uVar14 = (int)BStack_198.ptr - (int)BStack_198.start;
        if (bVar29) {
          uVar14 = BStack_198.bitsConsumed >> 3;
        }
        BStack_198.ptr = (char *)((long)BStack_198.ptr - (ulong)uVar14);
        BStack_198._12_4_ = 0;
        BStack_198.bitsConsumed = BStack_198.bitsConsumed + uVar14 * -8;
        BStack_198.bitContainer = *(size_t *)BStack_198.ptr;
      }
      else {
        BStack_198.ptr = (char *)((long)BStack_198.ptr - (ulong)(BStack_198.bitsConsumed >> 3));
        BStack_198._12_4_ = 0;
        BStack_198.bitsConsumed = BStack_198.bitsConsumed & 7;
        BStack_198.bitContainer = *(size_t *)BStack_198.ptr;
        bVar29 = true;
      }
    }
    else {
LAB_004c2163:
      bVar29 = false;
    }
    if ((puStack_f8 + -3 <= puVar21) || (!bVar29)) break;
    uVar15 = (BStack_198.bitContainer << ((byte)BStack_198.bitsConsumed & 0x3f)) >> bVar17;
    iVar23 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_198.bitsConsumed;
    uVar20 = (BStack_198.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    *puVar21 = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
    iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar23;
    uVar18 = (BStack_198.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    puVar21[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar23 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 5) + iVar23;
    uVar15 = (BStack_198.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    puVar21[2] = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
    BStack_198._12_4_ = 0;
    BStack_198.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
    puVar21[3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
    puVar21 = puVar21 + 4;
  } while( true );
  for (; puVar21 < puStack_f8; puVar21 = puVar21 + 1) {
    uVar15 = (BStack_198.bitContainer << ((byte)BStack_198.bitsConsumed & 0x3f)) >> bVar17;
    BStack_198._12_4_ = 0;
    BStack_198.bitsConsumed = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_198.bitsConsumed;
    *puVar21 = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
  }
  do {
    if (BStack_1c8.bitsConsumed < 0x41) {
      if (BStack_1c8.ptr < BStack_1c8.limitPtr) {
        if (BStack_1c8.ptr == BStack_1c8.start) goto LAB_004c22c1;
        bVar29 = BStack_1c8.start <=
                 (ulong *)((long)BStack_1c8.ptr - (ulong)(BStack_1c8.bitsConsumed >> 3));
        uVar14 = (int)BStack_1c8.ptr - iStack_f0;
        if (bVar29) {
          uVar14 = BStack_1c8.bitsConsumed >> 3;
        }
        BStack_1c8.ptr = (char *)((long)BStack_1c8.ptr - (ulong)uVar14);
        BStack_1c8._12_4_ = 0;
        BStack_1c8.bitsConsumed = BStack_1c8.bitsConsumed + uVar14 * -8;
        BStack_1c8.bitContainer = *(size_t *)BStack_1c8.ptr;
      }
      else {
        BStack_1c8.ptr = (char *)((long)BStack_1c8.ptr - (ulong)(BStack_1c8.bitsConsumed >> 3));
        BStack_1c8._12_4_ = 0;
        BStack_1c8.bitsConsumed = BStack_1c8.bitsConsumed & 7;
        BStack_1c8.bitContainer = *(size_t *)BStack_1c8.ptr;
        bVar29 = true;
      }
    }
    else {
LAB_004c22c1:
      bVar29 = false;
    }
    if ((puVar2 + -3 <= puVar28) || (!bVar29)) break;
    uVar15 = (BStack_1c8.bitContainer << ((byte)BStack_1c8.bitsConsumed & 0x3f)) >> bVar17;
    iVar23 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_1c8.bitsConsumed;
    uVar20 = (BStack_1c8.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    *puVar28 = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
    iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar23;
    uVar18 = (BStack_1c8.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    puVar28[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar23 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 5) + iVar23;
    uVar15 = (BStack_1c8.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    puVar28[2] = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
    BStack_1c8._12_4_ = 0;
    BStack_1c8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
    puVar28[3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
    puVar28 = puVar28 + 4;
  } while( true );
  for (; puVar28 < puVar2; puVar28 = puVar28 + 1) {
    uVar15 = (BStack_1c8.bitContainer << ((byte)BStack_1c8.bitsConsumed & 0x3f)) >> bVar17;
    BStack_1c8._12_4_ = 0;
    BStack_1c8.bitsConsumed = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_1c8.bitsConsumed;
    *puVar28 = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
  }
  do {
    if (BStack_120.bitsConsumed < 0x41) {
      if (BStack_120.ptr < BStack_120.limitPtr) {
        if (BStack_120.ptr == BStack_120.start) goto LAB_004c24b7;
        bVar29 = BStack_120.start <=
                 (size_t *)((long)BStack_120.ptr - (ulong)(BStack_120.bitsConsumed >> 3));
        uVar14 = (int)BStack_120.ptr - iStack_140;
        if (bVar29) {
          uVar14 = BStack_120.bitsConsumed >> 3;
        }
        BStack_120.ptr = (char *)((long)BStack_120.ptr - (ulong)uVar14);
        BStack_120.bitsConsumed = BStack_120.bitsConsumed + uVar14 * -8;
        BStack_120.bitContainer = *(size_t *)BStack_120.ptr;
      }
      else {
        BStack_120.ptr = (char *)((long)BStack_120.ptr - (ulong)(BStack_120.bitsConsumed >> 3));
        BStack_120.bitsConsumed = BStack_120.bitsConsumed & 7;
        BStack_120.bitContainer = *(size_t *)BStack_120.ptr;
        bVar29 = true;
      }
    }
    else {
LAB_004c24b7:
      bVar29 = false;
    }
    if ((puVar1 <= puStack_138) || (!bVar29)) {
      for (; puStack_138 < puVar26; puStack_138 = puStack_138 + 1) {
        uVar15 = (BStack_120.bitContainer << ((byte)BStack_120.bitsConsumed & 0x3f)) >> bVar17;
        BStack_120.bitsConsumed = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_120.bitsConsumed
        ;
        *puStack_138 = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
      }
      if (BStack_120.bitsConsumed != 0x40) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_120.ptr != BStack_120.start) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_1c8.bitsConsumed != 0x40) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_1c8.ptr != BStack_1c8.start) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_198.bitsConsumed != 0x40) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_198.ptr != BStack_198.start) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_168.bitsConsumed != 0x40) {
        sStack_70 = 0xffffffffffffffec;
      }
      if (BStack_168.ptr != BStack_168.start) {
        return 0xffffffffffffffec;
      }
      return sStack_70;
    }
    uVar15 = (BStack_120.bitContainer << ((byte)BStack_120.bitsConsumed & 0x3f)) >> bVar17;
    iVar23 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_120.bitsConsumed;
    uVar20 = (BStack_120.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    *puStack_138 = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
    iVar23 = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar23;
    uVar18 = (BStack_120.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    puStack_138[1] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
    iVar23 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 5) + iVar23;
    uVar15 = (BStack_120.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar17;
    puStack_138[2] = *(undefined1 *)((long)DTable + uVar18 * 2 + 4);
    BStack_120.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
    puStack_138[3] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
    puStack_138 = puStack_138 + 4;
  } while( true );
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize,
                                    const void* cSrc, size_t cSrcSize,
                                    const HUF_DTable* DTable)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#endif
}